

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.h
# Opt level: O0

bool __thiscall re2::Prog::Inst::Matches(Inst *this,int c)

{
  InstOp IVar1;
  bool local_21;
  int local_14;
  int c_local;
  Inst *this_local;
  
  IVar1 = opcode(this);
  if (IVar1 == kInstByteRange) {
    local_14 = c;
    if ((((this->field_1).field_3.foldcase_ != '\0') && (0x40 < c)) && (c < 0x5b)) {
      local_14 = c + 0x20;
    }
    local_21 = false;
    if ((int)(uint)(this->field_1).field_3.lo_ <= local_14) {
      local_21 = local_14 <= (int)(uint)(this->field_1).field_3.hi_;
    }
    return local_21;
  }
  __assert_fail("(opcode()) == (kInstByteRange)",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h",0x7e,
                "bool re2::Prog::Inst::Matches(int)");
}

Assistant:

inline bool Matches(int c) {
      DCHECK_EQ(opcode(), kInstByteRange);
      if (foldcase_ && 'A' <= c && c <= 'Z')
        c += 'a' - 'A';
      return lo_ <= c && c <= hi_;
    }